

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

bool __thiscall HighsSparseMatrix::operator==(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar3;
  double dVar4;
  MatrixFormat MVar7;
  MatrixFormat MVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  double *pdVar12;
  double *pdVar13;
  undefined1 auVar14 [16];
  int iVar15;
  byte bVar16;
  undefined4 uVar17;
  size_t sVar18;
  double *pdVar19;
  double *pdVar20;
  bool bVar21;
  bool bVar22;
  
  MVar7 = this->format_;
  MVar8 = matrix->format_;
  uVar1 = this->num_col_;
  uVar5 = this->num_row_;
  uVar2 = matrix->num_col_;
  uVar6 = matrix->num_row_;
  piVar9 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar10 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar18 = (long)piVar9 - (long)piVar10;
  piVar11 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (sVar18 == (long)(matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar11) {
    if (piVar9 == piVar10) {
      bVar21 = true;
    }
    else {
      iVar15 = bcmp(piVar10,piVar11,sVar18);
      bVar21 = iVar15 == 0;
    }
  }
  else {
    bVar21 = false;
  }
  piVar9 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar10 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  sVar18 = (long)piVar10 - (long)piVar9;
  piVar11 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (sVar18 == (long)(matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar11) {
    if (piVar10 == piVar9) {
      bVar22 = true;
    }
    else {
      iVar15 = bcmp(piVar9,piVar11,sVar18);
      bVar22 = iVar15 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  pdVar12 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar20 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar13 - (long)pdVar12 ==
      (long)(matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar20) {
    if (pdVar12 == pdVar13) {
      bVar16 = 1;
    }
    else {
      do {
        pdVar19 = pdVar12 + 1;
        dVar3 = *pdVar12;
        dVar4 = *pdVar20;
        bVar16 = -(dVar3 == dVar4) & 1;
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) break;
        pdVar20 = pdVar20 + 1;
        pdVar12 = pdVar19;
      } while (pdVar19 != pdVar13);
    }
  }
  else {
    bVar16 = 0;
  }
  auVar14._4_4_ = -(uint)(uVar1 == uVar2);
  auVar14._0_4_ = -(uint)(uVar1 == uVar2);
  auVar14._8_4_ = -(uint)(uVar5 == uVar6);
  auVar14._12_4_ = -(uint)(uVar5 == uVar6);
  uVar17 = movmskpd((int)pdVar13,auVar14);
  return (bool)((byte)uVar17 >> 1 & bVar21 & bVar22 & (byte)uVar17 & MVar7 == MVar8 & bVar16);
}

Assistant:

bool HighsSparseMatrix::operator==(const HighsSparseMatrix& matrix) const {
  bool equal = true;
  equal = this->format_ == matrix.format_ && equal;
  equal = this->num_col_ == matrix.num_col_ && equal;
  equal = this->num_row_ == matrix.num_row_ && equal;
  equal = this->start_ == matrix.start_ && equal;
  equal = this->index_ == matrix.index_ && equal;
  equal = this->value_ == matrix.value_ && equal;
  return equal;
}